

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

int __thiscall VWReaderHandler<false>::init(VWReaderHandler<false> *this,EVP_PKEY_CTX *ctx)

{
  example *peVar1;
  int iVar2;
  InsituStringStream *in_RCX;
  v_array<example_*> *in_RDX;
  char *in_R8;
  example_factory_t in_R9;
  void *in_stack_00000008;
  
  (this->ctx).all = (vw *)ctx;
  (this->ctx).key = " ";
  (this->ctx).key_length = 1;
  (this->ctx).previous_state = (BaseState<false> *)0x0;
  (this->ctx).label_object_state.found = false;
  (this->ctx).label_object_state.found_cb = false;
  (this->ctx).label_object_state.cb_label.cost = 0.0;
  (this->ctx).label_object_state.cb_label.action = 0;
  (this->ctx).label_object_state.cb_label.probability = 0.0;
  (this->ctx).label_object_state.cb_label.partial_prediction = 0.0;
  (this->ctx).examples = in_RDX;
  peVar1 = *in_RDX->_begin;
  (this->ctx).ex = peVar1;
  iVar2 = (**(code **)(*(long *)(ctx + 8) + 0x330))(&peVar1->l);
  (this->ctx).stream = in_RCX;
  (this->ctx).stream_end = in_R8;
  (this->ctx).example_factory = in_R9;
  (this->ctx).example_factory_context = in_stack_00000008;
  return iVar2;
}

Assistant:

void init(vw* all, v_array<example*>* examples, rapidjson::InsituStringStream* stream, const char* stream_end,
      VW::example_factory_t example_factory, void* example_factory_context)
  {
    ctx.init(all);
    ctx.examples = examples;
    ctx.ex = (*examples)[0];
    all->p->lp.default_label(&ctx.ex->l);

    ctx.stream = stream;
    ctx.stream_end = stream_end;
    ctx.example_factory = example_factory;
    ctx.example_factory_context = example_factory_context;
  }